

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line_to_quad<charls::transform_hp2<unsigned_short>::inverse,unsigned_short>
               (unsigned_short *source,size_t pixel_stride_in,quad<unsigned_short> *destination,
               size_t pixel_stride,inverse *transform)

{
  quad<unsigned_short> qVar1;
  triplet<unsigned_short> triplet_value;
  quad<unsigned_short> *pqVar2;
  quad<unsigned_short> local_48;
  quad<unsigned_short> pixel;
  size_t i;
  unsigned_long pixel_count;
  inverse *transform_local;
  size_t pixel_stride_local;
  quad<unsigned_short> *destination_local;
  size_t pixel_stride_in_local;
  unsigned_short *source_local;
  
  transform_local = (inverse *)pixel_stride;
  pixel_stride_local = (size_t)destination;
  destination_local = (quad<unsigned_short> *)pixel_stride_in;
  pixel_stride_in_local = (size_t)source;
  pqVar2 = (quad<unsigned_short> *)
           std::min<unsigned_long>
                     ((unsigned_long *)&transform_local,(unsigned_long *)&destination_local);
  qVar1 = *pqVar2;
  pixel.super_triplet<unsigned_short>.field_0 =
       (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)0x0;
  pixel.super_triplet<unsigned_short>.field_1 =
       (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)0x0;
  pixel.super_triplet<unsigned_short>.field_2 =
       (anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5)0x0;
  pixel.field_0 = (anon_union_2_2_7f9ecb5c_for_quad<unsigned_short>_2)0x0;
  for (; (ulong)pixel < (ulong)qVar1; pixel = (quad<unsigned_short>)((long)pixel + 1)) {
    triplet_value =
         transform_hp2<unsigned_short>::inverse::operator()
                   (transform,(uint)*(ushort *)(pixel_stride_in_local + (long)pixel * 2),
                    (uint)*(ushort *)
                           (pixel_stride_in_local +
                           ((long)&(destination_local->super_triplet<unsigned_short>).field_0 +
                           (long)pixel) * 2),
                    (uint)*(ushort *)
                           (pixel_stride_in_local + ((long)pixel + (long)destination_local * 2) * 2)
                   );
    quad<unsigned_short>::quad
              (&local_48,triplet_value,
               (uint)*(ushort *)
                      (pixel_stride_in_local + ((long)pixel + (long)destination_local * 3) * 2));
    *(quad<unsigned_short> *)(pixel_stride_local + (long)pixel * 8) = local_48;
  }
  return;
}

Assistant:

void transform_line_to_quad(const PixelType* source, const size_t pixel_stride_in, quad<PixelType>* destination,
                            const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> pixel(transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]),
                                    source[i + 3 * pixel_stride_in]);
        destination[i] = pixel;
    }
}